

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_BOOL qpdf_oh_get_value_as_utf8(qpdf_data qpdf,qpdf_oh oh,char **value,size_t *length)

{
  int iVar1;
  anon_class_24_3_0adacfeb local_80;
  function<int_(QPDFObjectHandle_&)> local_68;
  function<int_()> local_48;
  size_t *local_28;
  size_t *length_local;
  char **value_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_28 = length;
  length_local = (size_t *)value;
  value_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_48,return_false);
  local_80.qpdf = p_Stack_10;
  local_80.value = (char **)length_local;
  local_80.length = local_28;
  std::function<int(QPDFObjectHandle&)>::function<qpdf_oh_get_value_as_utf8::__0,void>
            ((function<int(QPDFObjectHandle&)> *)&local_68,&local_80);
  iVar1 = do_with_oh<int>(qpdf,oh,&local_48,&local_68);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_68);
  std::function<int_()>::~function(&local_48);
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_get_value_as_utf8(qpdf_data qpdf, qpdf_oh oh, char const** value, size_t* length)
{
    return do_with_oh<QPDF_BOOL>(
        qpdf, oh, return_false, [qpdf, value, length](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_value_as_utf8");
            auto result = o.getValueAsUTF8(qpdf->tmp_string);
            if (result) {
                *value = qpdf->tmp_string.c_str();
                *length = qpdf->tmp_string.length();
            }
            return result;
        });
}